

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mycontroller.cpp
# Opt level: O0

void Mycontroller::control(shared_ptr<Car> *car,SDL_Event *e)

{
  int iVar1;
  element_type *peVar2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  SDL_Event *local_18;
  SDL_Event *e_local;
  shared_ptr<Car> *car_local;
  
  iVar1 = (e->window).data2;
  local_18 = e;
  e_local = (SDL_Event *)car;
  if (iVar1 == 0x4000004f) {
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"horizontal",&local_c1);
    Car::setAxis(peVar2,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    Car::setDirection(peVar2,1);
  }
  else if (iVar1 == 0x40000050) {
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"horizontal",&local_99);
    Car::setAxis(peVar2,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    Car::setDirection(peVar2,-1);
  }
  else if (iVar1 == 0x40000051) {
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"vertical",&local_71);
    Car::setAxis(peVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    Car::setDirection(peVar2,1);
  }
  else if (iVar1 == 0x40000052) {
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vertical",&local_39);
    Car::setAxis(peVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    peVar2 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)car);
    Car::setDirection(peVar2,-1);
  }
  else if (iVar1 == 0x400000e0) {
    switchCars = (bool)((switchCars ^ 0xffU) & 1);
  }
  else if (iVar1 == 0x400000e4) {
    switchCars = (bool)((switchCars ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void Mycontroller::control( std::shared_ptr<Car>  car,  SDL_Event& e){


      switch (e.key.keysym.sym) {
        case SDLK_UP:
          car->setAxis("vertical");
          car->setDirection(-1);
          break;

        case SDLK_DOWN:
          car->setAxis("vertical");
          car->setDirection(1);   
          break;

        case SDLK_LEFT:
          car->setAxis("horizontal");    
          car->setDirection(-1);
          break;

        case SDLK_RIGHT:
          car->setAxis("horizontal");
          car->setDirection(1);
        
        break;        
        
        case SDLK_RCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
                
        case SDLK_LCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
      }
    }